

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O3

void __thiscall Lodtalk::GarbageCollector::internalPerformCollection(GarbageCollector *this)

{
  pointer ppSVar1;
  vector<Lodtalk::StackMemory_*,_std::allocator<Lodtalk::StackMemory_*>_> local_28;
  
  if (0 < this->disableCount) {
    return;
  }
  StackMemories::getAll(&local_28,this->memoryManager->stackMemories);
  ppSVar1 = (this->currentStacks).
            super__Vector_base<Lodtalk::StackMemory_*,_std::allocator<Lodtalk::StackMemory_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  (this->currentStacks).
  super__Vector_base<Lodtalk::StackMemory_*,_std::allocator<Lodtalk::StackMemory_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_28.super__Vector_base<Lodtalk::StackMemory_*,_std::allocator<Lodtalk::StackMemory_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->currentStacks).
  super__Vector_base<Lodtalk::StackMemory_*,_std::allocator<Lodtalk::StackMemory_*>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_28.super__Vector_base<Lodtalk::StackMemory_*,_std::allocator<Lodtalk::StackMemory_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->currentStacks).
  super__Vector_base<Lodtalk::StackMemory_*,_std::allocator<Lodtalk::StackMemory_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_28.super__Vector_base<Lodtalk::StackMemory_*,_std::allocator<Lodtalk::StackMemory_*>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_28.super__Vector_base<Lodtalk::StackMemory_*,_std::allocator<Lodtalk::StackMemory_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.super__Vector_base<Lodtalk::StackMemory_*,_std::allocator<Lodtalk::StackMemory_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.super__Vector_base<Lodtalk::StackMemory_*,_std::allocator<Lodtalk::StackMemory_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (ppSVar1 != (pointer)0x0) {
    operator_delete(ppSVar1);
    if (local_28.super__Vector_base<Lodtalk::StackMemory_*,_std::allocator<Lodtalk::StackMemory_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_28.
                      super__Vector_base<Lodtalk::StackMemory_*,_std::allocator<Lodtalk::StackMemory_*>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  mark(this);
  compact(this);
  return;
}

Assistant:

void GarbageCollector::internalPerformCollection()
{
    if(disableCount > 0)
        return;

	// Get the current stacks
	currentStacks = memoryManager->getStackMemories()->getAll();

	// TODO: Suspend the other GC threads.
	mark();
	compact();
}